

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseYyyyMmDd(char *zDate,DateTime *p)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int local_38;
  int local_2c;
  int neg;
  int D;
  int M;
  int Y;
  DateTime *p_local;
  char *zDate_local;
  
  cVar1 = *zDate;
  p_local = (DateTime *)zDate;
  if (cVar1 == '-') {
    p_local = (DateTime *)(zDate + 1);
  }
  _M = p;
  iVar2 = getDigits((char *)p_local,4,0,9999,0x2d,&D,2,1,0xc,0x2d,&neg,2,1,0x1f,0,&local_2c);
  if (iVar2 == 3) {
    p_local = (DateTime *)((long)&p_local->Y + 2);
    while( true ) {
      bVar3 = true;
      if ((""[(byte)p_local->iJD] & 1) == 0) {
        bVar3 = (char)p_local->iJD == 'T';
      }
      if (!bVar3) break;
      p_local = (DateTime *)((long)&p_local->iJD + 1);
    }
    iVar2 = parseHhMmSs((char *)p_local,_M);
    if (iVar2 != 0) {
      if ((char)p_local->iJD != '\0') {
        return 1;
      }
      _M->validHMS = '\0';
    }
    _M->validJD = '\0';
    _M->validYMD = '\x01';
    if (cVar1 != '-') {
      local_38 = D;
    }
    else {
      local_38 = -D;
    }
    _M->Y = local_38;
    _M->M = neg;
    _M->D = local_2c;
    if (_M->validTZ != '\0') {
      computeJD(_M);
    }
    zDate_local._4_4_ = 0;
  }
  else {
    zDate_local._4_4_ = 1;
  }
  return zDate_local._4_4_;
}

Assistant:

static int parseYyyyMmDd(const char *zDate, DateTime *p){
  int Y, M, D, neg;

  if( zDate[0]=='-' ){
    zDate++;
    neg = 1;
  }else{
    neg = 0;
  }
  if( getDigits(zDate,4,0,9999,'-',&Y,2,1,12,'-',&M,2,1,31,0,&D)!=3 ){
    return 1;
  }
  zDate += 10;
  while( sqlite3Isspace(*zDate) || 'T'==*(u8*)zDate ){ zDate++; }
  if( parseHhMmSs(zDate, p)==0 ){
    /* We got the time */
  }else if( *zDate==0 ){
    p->validHMS = 0;
  }else{
    return 1;
  }
  p->validJD = 0;
  p->validYMD = 1;
  p->Y = neg ? -Y : Y;
  p->M = M;
  p->D = D;
  if( p->validTZ ){
    computeJD(p);
  }
  return 0;
}